

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::tryRead
          (BlockedPumpFrom *this,void *readBuffer,size_t minBytes,size_t maxBytes)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  PromiseNode *extraout_RDX;
  _func_int **pp_Var2;
  void *in_R8;
  _func_int **pp_Var3;
  Promise<unsigned_long> PVar4;
  Own<kj::_::PromiseNode> local_80;
  Fault f;
  Own<kj::_::PromiseNode> local_60;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  
  if (*(long *)((long)readBuffer + 0x38) == 0) {
    pp_Var3 = (_func_int **)
              (*(long *)((long)readBuffer + 0x28) - *(long *)((long)readBuffer + 0x30));
    pp_Var2 = (_func_int **)maxBytes;
    if (pp_Var3 < maxBytes) {
      pp_Var2 = pp_Var3;
    }
    (**(code **)(**(long **)((long)readBuffer + 0x20) + 8))
              (&local_60,*(long **)((long)readBuffer + 0x20),minBytes,pp_Var2);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x50);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_60,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:505:17),_kj::_::PropagateException>
               ::anon_class_40_5_41c1fbba_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00431290;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)readBuffer;
    this_00[1].dependency.disposer = (Disposer *)minBytes;
    this_00[1].dependency.ptr = (PromiseNode *)maxBytes;
    this_00[1].continuationTracePtr = in_R8;
    this_00[2].super_PromiseNode._vptr_PromiseNode = pp_Var2;
    f.exception = (Exception *)
                  &_::
                   HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::tryRead(void*,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
                   ::instance;
    _::maybeChain<unsigned_long>(&local_50,(Promise<unsigned_long> *)&f);
    pPVar1 = local_50.ptr;
    local_40.disposer = local_50.disposer;
    local_50.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_50);
    local_80.disposer = local_50.disposer;
    local_80.ptr = pPVar1;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_40);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
    newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
              ((kj *)this,(Canceler *)((long)readBuffer + 0x38),(Promise<unsigned_long> *)&local_80)
    ;
    Own<kj::_::PromiseNode>::dispose(&local_80);
    Own<kj::_::PromiseNode>::dispose(&local_60);
    PVar4.super_PromiseBase.node.ptr = extraout_RDX;
    PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<unsigned_long>)PVar4.super_PromiseBase.node;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,499,FAILED,"canceler.isEmpty()","\"already pumping\"",(char (*) [16])"already pumping"
            );
  _::Debug::Fault::fatal(&f);
}

Assistant:

Promise<size_t> tryRead(void* readBuffer, size_t minBytes, size_t maxBytes) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      auto pumpLeft = amount - pumpedSoFar;
      auto min = kj::min(pumpLeft, minBytes);
      auto max = kj::min(pumpLeft, maxBytes);
      return canceler.wrap(input.tryRead(readBuffer, min, max)
          .then([this,readBuffer,minBytes,maxBytes,min](size_t actual) -> kj::Promise<size_t> {
        canceler.release();
        pumpedSoFar += actual;
        KJ_ASSERT(pumpedSoFar <= amount);

        if (pumpedSoFar == amount || actual < min) {
          // Either we pumped all we wanted or we hit EOF.
          fulfiller.fulfill(kj::cp(pumpedSoFar));
          pipe.endState(*this);
        }

        if (actual >= minBytes) {
          return actual;
        } else {
          return pipe.tryRead(reinterpret_cast<byte*>(readBuffer) + actual,
                              minBytes - actual, maxBytes - actual)
              .then([actual](size_t actual2) { return actual + actual2; });
        }
      }));
    }